

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.h
# Opt level: O1

void __thiscall chrono::ChLinkLockRevolute::~ChLinkLockRevolute(ChLinkLockRevolute *this)

{
  chrono::ChLinkLock::~ChLinkLock(&this->super_ChLinkLock);
  free(*(void **)&this[-1].field_0xe88);
  return;
}

Assistant:

class ChApi ChLinkLockRevolute : public ChLinkLock {
  public:
    ChLinkLockRevolute() { ChangeLinkType(LinkType::REVOLUTE); }

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLinkLockRevolute* Clone() const override { return new ChLinkLockRevolute(*this); }

    /// Lock the joint.
    /// If enabled (lock = true) this effectively converts this joint into a weld joint.
    /// If lock = false, the joint reverts to its original degrees of freedom.
    void Lock(bool lock);
}